

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

shared_ptr<ear::PointSourcePanner> __thiscall ear::configurePolarPanner(ear *this,Layout *layout)

{
  long *plVar1;
  int iVar2;
  internal_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool bVar4;
  _Bit_iterator _Var5;
  shared_ptr<ear::PointSourcePanner> sVar6;
  string local_90;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  vector<bool,_std::allocator<bool>_> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  Layout::isLfe(&local_50,layout);
  local_90._M_dataplus._M_p._0_1_ = 1;
  _Var5 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                    (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                     local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  if ((_Var5.super__Bit_iterator_base._M_p ==
       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     (_Var5.super__Bit_iterator_base._M_offset ==
      local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset)) {
    checkScreenSpeakers(layout);
    Layout::name_abi_cxx11_(&local_90,layout);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"0+2+0","");
    plVar1 = local_70;
    if (local_90._M_string_length == local_68) {
      if (local_90._M_string_length == 0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(local_90._M_dataplus._M_p,local_70,local_90._M_string_length);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (plVar1 != local_60) {
      operator_delete(plVar1,local_60[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      sVar6 = configureStereoPolarPanner(this,layout);
      _Var3 = sVar6.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      sVar6 = configureFullPolarPanner((Layout *)this);
      _Var3 = sVar6.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      _Var3._M_pi = extraout_RDX;
    }
    sVar6.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    sVar6.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<ear::PointSourcePanner>)
           sVar6.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (internal_error *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"lfe channel passed to point source panner","");
  internal_error::internal_error(this_00,&local_90);
  __cxa_throw(this_00,&internal_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<PointSourcePanner> configurePolarPanner(
      const Layout& layout) {
    auto isLfe = layout.isLfe();
    if (find(isLfe.begin(), isLfe.end(), true) != isLfe.end()) {
      throw internal_error("lfe channel passed to point source panner");
    }

    checkScreenSpeakers(layout);

    if (layout.name() == std::string("0+2+0")) {
      return configureStereoPolarPanner(layout);
    } else {
      return configureFullPolarPanner(layout);
    }
  }